

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_2::SetupAdapter::SetupAdapter
          (SetupAdapter *this,string *username,string *password,seconds timeout)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *password_local;
  string *username_local;
  SetupAdapter *this_local;
  seconds timeout_local;
  
  local_28 = password;
  password_local = username;
  username_local = &this->auth_;
  this_local = (SetupAdapter *)timeout.__r;
  ::std::__cxx11::string::string((string *)this);
  (this->timeout_).__r = (rep)this_local;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::operator+(local_68,(char *)password_local);
    ::std::operator+(local_48,local_68);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_48);
    ::std::__cxx11::string::~string((string *)local_48);
    ::std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

SetupAdapter(const std::string& username, const std::string& password,
               std::chrono::seconds timeout)
      : timeout_(timeout) {
    if (!username.empty()) {
      auth_ = username + ":" + password;
    }
  }